

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialSurfaceSMC.cpp
# Opt level: O2

void __thiscall
chrono::ChMaterialSurfaceSMC::ChMaterialSurfaceSMC
          (ChMaterialSurfaceSMC *this,ChMaterialSurfaceSMC *other)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  ChMaterialSurface::ChMaterialSurface
            (&this->super_ChMaterialSurface,&other->super_ChMaterialSurface);
  (this->super_ChMaterialSurface)._vptr_ChMaterialSurface =
       (_func_int **)&PTR__ChMaterialSurface_011614b0;
  fVar1 = other->constant_adhesion;
  fVar2 = other->adhesionMultDMT;
  fVar3 = other->adhesionSPerko;
  fVar4 = other->kn;
  fVar5 = other->kt;
  fVar6 = other->gn;
  *(undefined8 *)&(this->super_ChMaterialSurface).field_0x1c =
       *(undefined8 *)&(other->super_ChMaterialSurface).field_0x1c;
  this->constant_adhesion = fVar1;
  this->adhesionMultDMT = fVar2;
  this->adhesionSPerko = fVar3;
  this->kn = fVar4;
  this->kt = fVar5;
  this->gn = fVar6;
  this->gt = other->gt;
  return;
}

Assistant:

ChMaterialSurfaceSMC::ChMaterialSurfaceSMC(const ChMaterialSurfaceSMC& other) : ChMaterialSurface(other) {
    young_modulus = other.young_modulus;
    poisson_ratio = other.poisson_ratio;
    constant_adhesion = other.constant_adhesion;
    adhesionMultDMT = other.adhesionMultDMT;
    adhesionSPerko = other.adhesionSPerko;
    kn = other.kn;
    kt = other.kt;
    gn = other.gn;
    gt = other.gt;
}